

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::setPricer
          (SPxSolverBase<double> *this,SPxPricer<double> *x,bool destroy)

{
  SPxPricer<double> *pSVar1;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  if (this->freePricer == true) {
    if (this->thepricer != (SPxPricer<double> *)0x0) {
      (*this->thepricer->_vptr_SPxPricer[0x15])();
    }
    this->thepricer = (SPxPricer<double> *)0x0;
  }
  if ((x != (SPxPricer<double> *)0x0) && (this->thepricer != x)) {
    setPricing(this,FULL);
    if (this->initialized == true) {
      (*x->_vptr_SPxPricer[1])(x,this);
    }
    else {
      (*x->_vptr_SPxPricer[2])(x);
    }
  }
  pSVar1 = this->thepricer;
  if (pSVar1 != x && pSVar1 != (SPxPricer<double> *)0x0) {
    (*pSVar1->_vptr_SPxPricer[2])();
  }
  this->thepricer = x;
  if (x != (SPxPricer<double> *)0x0) {
    local_28 = (this->super_SPxLPBase<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_20 = (this->super_SPxLPBase<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_20->_M_use_count = local_20->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_20->_M_use_count = local_20->_M_use_count + 1;
      }
    }
    (*x->_vptr_SPxPricer[6])(x,&local_28);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
  }
  this->freePricer = destroy;
  return;
}

Assistant:

void SPxSolverBase<R>::setPricer(SPxPricer<R>* x, const bool destroy)
{

   assert(!freePricer || thepricer != nullptr);

   if(freePricer)
   {
      delete thepricer;
      thepricer = nullptr;
   }

   if(x != nullptr && x != thepricer)
   {
      setPricing(FULL);

      if(isInitialized())
         x->load(this);
      else
         x->clear();
   }

   if(thepricer && thepricer != x)
      thepricer->clear();

   thepricer = x;

   if(thepricer != nullptr)
      thepricer->setTolerances(this->tolerances());

   freePricer = destroy;
}